

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<F3DFloor_*,_F3DFloor_*>::~TDeletingArray
          (TDeletingArray<F3DFloor_*,_F3DFloor_*> *this)

{
  F3DFloor *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<F3DFloor_*,_F3DFloor_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (this->super_TArray<F3DFloor_*,_F3DFloor_*>).Array[uVar3];
      if (pFVar1 != (F3DFloor *)0x0) {
        operator_delete(pFVar1,0x98);
        uVar2 = (this->super_TArray<F3DFloor_*,_F3DFloor_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&this->super_TArray<F3DFloor_*,_F3DFloor_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}